

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QDBusMenuLayoutItem>::clear(QList<QDBusMenuLayoutItem> *this)

{
  Data *pDVar1;
  QDBusMenuLayoutItem *pQVar2;
  longlong lVar3;
  __off_t in_RDX;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QDBusMenuLayoutItem> local_38;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).size != 0) {
    pDVar1 = (this->d).d;
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtPrivate::QGenericArrayOps<QDBusMenuLayoutItem>::truncate
                  ((QGenericArrayOps<QDBusMenuLayoutItem> *)this,(char *)0x0,in_RDX);
        return;
      }
      goto LAB_0064ad29;
    }
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QDBusMenuLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    if (pDVar1 == (Data *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = (pDVar1->super_QArrayData).alloc;
    }
    local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QDBusMenuLayoutItem *)QArrayData::allocate(&local_20,0x28,0x10,lVar3,KeepSize);
    local_38.d = (this->d).d;
    local_38.ptr = (this->d).ptr;
    (this->d).d = (Data *)local_20;
    (this->d).ptr = pQVar2;
    local_38.size = (this->d).size;
    (this->d).size = 0;
    QArrayDataPointer<QDBusMenuLayoutItem>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0064ad29:
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }